

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O0

void __thiscall binlog::EventStream::readEventSource(EventStream *this,Range range)

{
  EventSource *in_RDI;
  EventSource eventSource;
  EventSource *in_stack_00000170;
  key_type in_stack_00000178;
  SegmentedMap<binlog::EventSource> *in_stack_00000180;
  Range *in_stack_ffffffffffffff08;
  
  EventSource::EventSource(in_RDI);
  mserialize::deserialize<binlog::EventSource,binlog::Range>(in_RDI,in_stack_ffffffffffffff08);
  detail::SegmentedMap<binlog::EventSource>::emplace<binlog::EventSource>
            (in_stack_00000180,in_stack_00000178,in_stack_00000170);
  EventSource::~EventSource(in_RDI);
  return;
}

Assistant:

void EventStream::readEventSource(Range range)
{
  EventSource eventSource;
  mserialize::deserialize(eventSource, range);
  _eventSources.emplace(eventSource.id, std::move(eventSource));
}